

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

void shar_quote(archive_string *buf,char *str,int in_shell)

{
  archive_string *as;
  int in_EDX;
  char *in_RSI;
  void *in_RDI;
  archive_string *unaff_retaddr;
  size_t len;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  
  while (*in_RSI != '\0') {
    as = (archive_string *)strcspn(in_RSI,"\n \t\'`\";&<>()|*?{}[]\\$!#^~");
    if (as == (archive_string *)0x0) {
      if (*in_RSI == '\n') {
        if (in_EDX == 0) {
          archive_strcat((archive_string *)0x0,
                         (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
        }
        else {
          archive_strcat((archive_string *)0x0,
                         (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
        }
      }
      else {
        archive_strappend_char((archive_string *)0x0,in_stack_ffffffffffffffdf);
        archive_strappend_char(as,in_stack_ffffffffffffffdf);
      }
      in_RSI = in_RSI + 1;
    }
    else {
      archive_strncat(unaff_retaddr,in_RDI,(size_t)in_RSI);
      in_RSI = in_RSI + (long)&as->s;
    }
  }
  return;
}

Assistant:

static void
shar_quote(struct archive_string *buf, const char *str, int in_shell)
{
	static const char meta[] = "\n \t'`\";&<>()|*?{}[]\\$!#^~";
	size_t len;

	while (*str != '\0') {
		if ((len = strcspn(str, meta)) != 0) {
			archive_strncat(buf, str, len);
			str += len;
		} else if (*str == '\n') {
			if (in_shell)
				archive_strcat(buf, "\"\n\"");
			else
				archive_strcat(buf, "\\n");
			++str;
		} else {
			archive_strappend_char(buf, '\\');
			archive_strappend_char(buf, *str);
			++str;
		}
	}
}